

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::OptionParser(OptionParser *this,char *program_name,char *description)

{
  char *pcVar1;
  anon_class_8_1_8991fb9c local_40;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *description_local;
  char *program_name_local;
  OptionParser *this_local;
  
  local_20 = description;
  description_local = program_name;
  program_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,program_name,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->description_,pcVar1,local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::vector
            (&this->options_);
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::vector
            (&this->arguments_);
  local_40.this = this;
  std::function<void(char_const*)>::
  function<wabt::OptionParser::OptionParser(char_const*,char_const*)::__0,void>
            ((function<void(char_const*)> *)&this->on_error_,&local_40);
  return;
}

Assistant:

OptionParser::OptionParser(const char* program_name, const char* description)
    : program_name_(program_name),
      description_(description),
      on_error_([this](const std::string& message) { DefaultError(message); }) {
}